

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInput.cpp
# Opt level: O1

short __thiscall gr::GrBufferIStream::ReadShortFromFont(GrBufferIStream *this)

{
  ushort uVar1;
  undefined4 *puVar2;
  
  if ((this->m_pbLim != (byte *)0x0) && ((long)this->m_pbLim - (long)this->m_pbNext < 2)) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0x80000001;
    __cxa_throw(puVar2,&GrResult::typeinfo,0);
  }
  uVar1 = *(ushort *)this->m_pbNext;
  this->m_pbNext = (byte *)((long)this->m_pbNext + 2);
  return uVar1 << 8 | uVar1 >> 8;
}

Assistant:

short GrBufferIStream::ReadShortFromFont()
{
	short snInput;

    if (m_pbLim && 2 > m_pbLim - m_pbNext)
        THROW(kresReadFault);

    snInput = (m_pbNext[0] << 8) + m_pbNext[1];
	m_pbNext += 2;
	return snInput;
}